

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O1

void OrderTree(QuadTreeNode *Tree,int PostTree)

{
  long *plVar1;
  int *piVar2;
  long *plVar3;
  int *piVar4;
  long *plVar5;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  long lVar9;
  
  if (Tree->Children == (QuadTreeNode *)0x0) {
    if (*(long **)((long)(&Tree->Bounder + 1) + ((ulong)(PostTree != 0) * 2 + 2) * 4) != (long *)0x0
       ) {
      plVar5 = (long *)0x0;
      plVar6 = *(long **)((long)(&Tree->Bounder + 1) + ((ulong)(PostTree != 0) * 2 + 2) * 4);
      plVar7 = (long *)0x0;
      do {
        plVar8 = plVar7;
        plVar1 = plVar6;
        plVar3 = plVar5;
        if ((int)plVar6[1] == 1) {
          plVar8 = plVar6;
          plVar1 = plVar5;
          plVar3 = plVar7;
        }
        plVar5 = plVar1;
        plVar1 = (long *)*plVar6;
        *plVar6 = (long)plVar3;
        plVar6 = plVar1;
        plVar7 = plVar8;
      } while (plVar1 != (long *)0x0);
      *(long **)((long)(&Tree->Bounder + 1) + ((ulong)(PostTree != 0) * 2 + 2) * 4) = plVar8;
      piVar2 = (int *)((long)(&Tree->Bounder + 1) + ((ulong)(PostTree != 0) * 2 + 2) * 4);
      do {
        piVar4 = piVar2;
        piVar2 = *(int **)piVar4;
      } while (piVar2 != (int *)0x0);
      *(long **)piVar4 = plVar5;
    }
  }
  else {
    lVar9 = 0xd8;
    do {
      OrderTree((QuadTreeNode *)((long)(Tree->Children->Bounder).TL.Pos + lVar9),PostTree);
      lVar9 = lVar9 + -0x48;
    } while (lVar9 != -0x48);
  }
  return;
}

Assistant:

void OrderTree(struct QuadTreeNode *Tree, int PostTree)
{
   struct Container *Objects, *NonObjects, *P, *PNext, **ITree;
   int c = 4;

   if (Tree->Children) {
      while (c--)
         OrderTree(&Tree->Children[c], PostTree);
   } else {
      ITree = PostTree ? &Tree->PostContents : &Tree->Contents;

      if (*ITree) {
         /* separate object and non-oject lists */
         Objects = NonObjects = NULL;
         P = *ITree;
         while (P) {
            PNext = P->Next;

            if (P->Type == OBJECT) {
               P->Next = Objects;
               Objects = P;
            } else {
               P->Next = NonObjects;
               NonObjects = P;
            }

            P = PNext;
         }

         /* now reintegrate lists - objects then non-objects */
         *ITree = Objects;
         while (*ITree)
            ITree = &(*ITree)->Next;
         *ITree = NonObjects;
      }
   }
}